

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KryoFlux.cpp
# Opt level: O2

void __thiscall KryoFlux::UploadFirmware(KryoFlux *this)

{
  bool bVar1;
  int iVar2;
  posix_error *this_00;
  int *piVar3;
  exception *this_01;
  int iVar4;
  int iVar5;
  ulong uVar6;
  istreambuf_iterator<char,_std::char_traits<char>_> __first;
  allocator<char> local_2b1;
  string local_2b0;
  string local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> fwpath;
  vector<unsigned_char,_std::allocator<unsigned_char>_> fwverify;
  vector<unsigned_char,_std::allocator<unsigned_char>_> fwdata;
  ifstream fwfile;
  byte abStack_200 [200];
  undefined8 auStack_138 [36];
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fwfile,"T#",(allocator<char> *)&local_2b0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fwpath,">",(allocator<char> *)&local_290);
  SamBaCommand(this,(string *)&fwfile,&fwpath);
  std::__cxx11::string::~string((string *)&fwpath);
  std::__cxx11::string::~string((string *)&fwfile);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fwfile,"N#",(allocator<char> *)&local_2b0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fwpath,"\n\r",(allocator<char> *)&local_290);
  SamBaCommand(this,(string *)&fwfile,&fwpath);
  std::__cxx11::string::~string((string *)&fwpath);
  std::__cxx11::string::~string((string *)&fwfile);
  util::resource_dir_abi_cxx11_();
  std::operator+(&fwpath,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &fwfile,KF_FW_FILE);
  std::__cxx11::string::~string((string *)&fwfile);
  std::ifstream::ifstream(&fwfile,(string *)&fwpath,_S_bin);
  if ((abStack_200[*(long *)(_fwfile + -0x18)] & 5) != 0) {
    this_00 = (posix_error *)__cxa_allocate_exception(0x20);
    piVar3 = __errno_location();
    posix_error::posix_error(this_00,*piVar3,fwpath._M_dataplus._M_p);
    __cxa_throw(this_00,&posix_error::typeinfo,std::system_error::~system_error);
  }
  __first._8_8_ = 0xffffffffffffffff;
  __first._M_sbuf = *(streambuf_type **)((long)auStack_138 + *(long *)(_fwfile + -0x18));
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  vector<std::istreambuf_iterator<char,std::char_traits<char>>,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&fwdata,__first,
             (istreambuf_iterator<char,_std::char_traits<char>_>)(ZEXT816(0xffffffff) << 0x40),
             (allocator_type *)&local_2b0);
  uVar6 = (long)fwdata.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)fwdata.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  iVar5 = (int)uVar6;
  util::fmt_abi_cxx11_(&local_2b0,"S%08lx,%08lx#",0x202000,uVar6 & 0xffffffff);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_290,"",(allocator<char> *)&fwverify);
  SamBaCommand(this,&local_2b0,&local_290);
  std::__cxx11::string::~string((string *)&local_290);
  std::__cxx11::string::~string((string *)&local_2b0);
  for (iVar4 = 0; iVar4 < iVar5; iVar4 = iVar4 + iVar2) {
    iVar2 = (**(code **)(*(long *)this + 0x28))
                      (this,fwdata.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                            ._M_impl.super__Vector_impl_data._M_start + iVar4);
  }
  util::fmt_abi_cxx11_(&local_2b0,"R%08lx,%08lx#",0x202000,uVar6 & 0xffffffff);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_290,"",(allocator<char> *)&fwverify);
  SamBaCommand(this,&local_2b0,&local_290);
  std::__cxx11::string::~string((string *)&local_290);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&fwverify,(long)iVar5,(allocator_type *)&local_2b0);
  for (iVar4 = 0; iVar4 < iVar5; iVar4 = iVar4 + iVar2) {
    iVar2 = (**(code **)(*(long *)this + 0x20))
                      (this,fwverify.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start + iVar4);
  }
  bVar1 = std::operator!=(&fwdata,&fwverify);
  if (!bVar1) {
    util::fmt_abi_cxx11_(&local_2b0,"G%08lx#",0x202000);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_290,"",&local_2b1);
    SamBaCommand(this,&local_2b0,&local_290);
    std::__cxx11::string::~string((string *)&local_290);
    std::__cxx11::string::~string((string *)&local_2b0);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&fwverify.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&fwdata.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    std::ifstream::~ifstream(&fwfile);
    std::__cxx11::string::~string((string *)&fwpath);
    return;
  }
  this_01 = (exception *)__cxa_allocate_exception(0x10);
  util::exception::exception<char_const(&)[29]>
            (this_01,(char (*) [29])"firmware verification failed");
  __cxa_throw(this_01,&util::exception::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void KryoFlux::UploadFirmware()
{
    // Set interactive then non-interactive mode, to check for boot responses
    // https://sourceforge.net/p/lejos/wiki-nxt/SAM-BA%20Protocol/
    SamBaCommand("T#", ">");
    SamBaCommand("N#", "\n\r");

    auto fwpath = util::resource_dir() + KF_FW_FILE;
    std::ifstream fwfile(fwpath, std::ios::binary);
    if (!fwfile)
        throw posix_error(errno, fwpath.c_str());

    auto fwdata = std::vector<uint8_t>(std::istreambuf_iterator<char>(fwfile),
        std::istreambuf_iterator<char>());
    auto fwsize = static_cast<int>(fwdata.size());

    SamBaCommand(util::fmt("S%08lx,%08lx#", KF_FW_LOAD_ADDR, fwsize));

    auto offset = 0;
    while (offset < fwsize)
        offset += Write(fwdata.data() + offset, fwsize - offset);

    SamBaCommand(util::fmt("R%08lx,%08lx#", KF_FW_LOAD_ADDR, fwsize));

    std::vector<uint8_t> fwverify(fwsize);
    for (offset = 0; offset < fwsize; )
        offset += Read(fwverify.data() + offset, fwsize - offset);

    if (fwdata != fwverify)
        throw util::exception("firmware verification failed");

    SamBaCommand(util::fmt("G%08lx#", KF_FW_EXEC_ADDR));
}